

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

void __thiscall Js::InterpreterStackFrame::ProcessCatch(InterpreterStackFrame *this)

{
  long lVar1;
  
  if (*(char *)(*(long *)(this + 0x78) + 0x143f) == '\x01') {
    TTD::ExecutionInfoManager::ProcessCatchInfoForLastExecutedStatements
              (*(ExecutionInfoManager **)(*(long *)(*(long *)(this + 0x78) + 0x3b8) + 0x16b0));
  }
  lVar1 = *(long *)(*(long *)(this + 0x88) + 0x20);
  if (((*(long *)(lVar1 + 0x80) != 0) || ((*(byte *)(lVar1 + 0xa8) & 0x20) != 0)) &&
     ((*(byte *)(lVar1 + 0xa8) & 0x40) != 0)) {
    DebugProcess(this);
    return;
  }
  Process(this);
  return;
}

Assistant:

void InterpreterStackFrame::ProcessCatch()
    {
#if ENABLE_TTD
        //Clear any previous Exception Info
        if (SHOULD_DO_TTD_STACK_STMT_OP(this->scriptContext))
        {
            this->scriptContext->GetThreadContext()->TTDExecutionInfo->ProcessCatchInfoForLastExecutedStatements();
        }
#endif
#ifdef ENABLE_SCRIPT_DEBUGGING
        if (this->IsInDebugMode())
        {
            this->DebugProcess();
        }
        else
#endif
        {
            this->Process();
        }
    }